

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

SP __thiscall pbrt::QuadMesh::makeFrom(QuadMesh *this,SP *tris)

{
  ulong uVar1;
  pointer *ppvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pvVar6;
  bool bVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  QuadMesh *pQVar9;
  ulong uVar10;
  pointer pvVar11;
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  iterator iVar14;
  ulong uVar15;
  undefined8 uVar16;
  SP SVar17;
  SP out;
  QuadMesh *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  vec4i local_78;
  QuadMesh *local_60;
  SP local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  
  local_88 = (QuadMesh *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::QuadMesh,std::allocator<pbrt::QuadMesh>,std::shared_ptr<pbrt::Material>&>
            (&local_80,&local_88,(allocator<pbrt::QuadMesh> *)&local_78,
             &(((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_Shape).material);
  std::__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::QuadMesh,pbrt::QuadMesh>
            ((__shared_ptr<pbrt::QuadMesh,(__gnu_cxx::_Lock_policy)2> *)&local_88,local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::operator=(&(local_88->super_Shape).textures._M_t,
              &(((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->super_Shape).textures._M_t);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            (&local_88->vertex,
             &((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              vertex);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator=
            (&local_88->normal,
             &((tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              normal);
  peVar12 = (tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pvVar11 = (peVar12->index).
            super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
            super__Vector_impl_data._M_start;
  pvVar6 = (peVar12->index).
           super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = ((long)pvVar6 - (long)pvVar11 >> 2) * -0x5555555555555555;
  local_60 = this;
  if (pvVar6 != pvVar11) {
    uVar15 = 0;
    do {
      iVar3 = pvVar11[uVar15].x;
      uVar16._0_4_ = pvVar11[uVar15].y;
      uVar16._4_4_ = pvVar11[uVar15].z;
      uVar1 = uVar15 + 1;
      if (uVar1 < uVar10) {
        iVar4 = pvVar11[uVar1].y;
        iVar5 = pvVar11[uVar1].z;
        if ((pvVar11[uVar1].x == iVar3) && (iVar4 == uVar16._4_4_)) {
          iVar14._M_current =
               (local_88->index).
               super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_78.w = iVar5;
          if (iVar14._M_current ==
              (local_88->index).
              super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            uStack_40 = 0;
            local_78.x = iVar3;
            local_78.y = (undefined4)uVar16;
            local_78.z = uVar16._4_4_;
            local_48 = uVar16;
            std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
            _M_realloc_insert<pbrt::math::vec4i>(&local_88->index,iVar14,&local_78);
            uVar16 = local_48;
          }
          else {
LAB_001451d7:
            (iVar14._M_current)->x = iVar3;
            (iVar14._M_current)->y = (undefined4)uVar16;
            (iVar14._M_current)->z = uVar16._4_4_;
            (iVar14._M_current)->w = local_78.w;
            ppvVar2 = &(local_88->index).
                       super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppvVar2 = *ppvVar2 + 1;
            local_78.x = iVar3;
            local_78.y = (undefined4)uVar16;
            local_78.z = uVar16._4_4_;
          }
LAB_001451e9:
          bVar7 = false;
          uVar15 = uVar1;
        }
        else {
          bVar7 = true;
          if ((pvVar11[uVar1].x == uVar16._4_4_) && (iVar5 == iVar3)) {
            iVar14._M_current =
                 (local_88->index).
                 super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_78.w = iVar4;
            if (iVar14._M_current !=
                (local_88->index).
                super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_001451d7;
            uStack_40 = 0;
            local_78.x = iVar3;
            local_78.y = (undefined4)uVar16;
            local_78.z = uVar16._4_4_;
            local_48 = uVar16;
            std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
            _M_realloc_insert<pbrt::math::vec4i>(&local_88->index,iVar14,&local_78);
            uVar16 = local_48;
            goto LAB_001451e9;
          }
        }
        if (bVar7) goto LAB_001451f2;
      }
      else {
LAB_001451f2:
        local_78.z = (int)((ulong)uVar16 >> 0x20);
        local_78.y = (int)uVar16;
        iVar14._M_current =
             (local_88->index).
             super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_78.w = local_78.z;
        if (iVar14._M_current ==
            (local_88->index).
            super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_78.x = iVar3;
          std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::
          _M_realloc_insert<pbrt::math::vec4i>(&local_88->index,iVar14,&local_78);
        }
        else {
          (iVar14._M_current)->x = iVar3;
          (iVar14._M_current)->y = local_78.y;
          (iVar14._M_current)->z = local_78.z;
          (iVar14._M_current)->w = local_78.z;
          ppvVar2 = &(local_88->index).
                     super__Vector_base<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppvVar2 = *ppvVar2 + 1;
          local_78.x = iVar3;
        }
      }
      uVar15 = uVar15 + 1;
      peVar12 = (tris->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pvVar11 = (peVar12->index).
                super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar10 = ((long)(peVar12->index).
                      super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >> 2) *
               -0x5555555555555555;
    } while (uVar15 < uVar10);
  }
  pQVar9 = local_60;
  _Var8._M_pi = local_80._M_pi;
  _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar10 * 3);
  if (((long)(peVar12->vertex).
             super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(peVar12->vertex).
             super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 + uVar10 * -3 == 0) {
    local_58.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
    local_58.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_80._M_pi;
    if ((element_type *)local_80._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((enable_shared_from_this<pbrt::Entity> *)&(local_80._M_pi)->_M_use_count)->
                 _M_weak_this).super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((enable_shared_from_this<pbrt::Entity> *)&(local_80._M_pi)->_M_use_count)->
                      _M_weak_this).super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((enable_shared_from_this<pbrt::Entity> *)&(local_80._M_pi)->_M_use_count)->
                 _M_weak_this).super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(int *)&(((enable_shared_from_this<pbrt::Entity> *)&(local_80._M_pi)->_M_use_count)->
                      _M_weak_this).super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
      }
    }
    SVar17 = remeshVertices((pbrt *)local_60,&local_58);
    _Var13 = SVar17.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((element_type *)
        local_58.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      _Var13._M_pi = extraout_RDX;
    }
  }
  else {
    (local_60->super_Shape).super_Entity._vptr_Entity = (_func_int **)local_88;
    (local_60->super_Shape).super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_60->super_Shape).super_Entity.super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
    super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var8._M_pi;
    local_88 = (QuadMesh *)0x0;
  }
  if ((element_type *)local_80._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
    _Var13._M_pi = extraout_RDX_00;
  }
  SVar17.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  SVar17.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pQVar9;
  return (SP)SVar17.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QuadMesh::SP QuadMesh::makeFrom(TriangleMesh::SP tris)
  {
    QuadMesh::SP out = std::make_shared<QuadMesh>(tris->material);
    out->textures = tris->textures;
    // out->texcoord = in->texcoord;
    out->vertex   = tris->vertex;
    out->normal   = tris->normal;
      
    for (size_t i=0;i<tris->index.size();i++) {
      vec3i idx0 = tris->index[i+0];
      if ((i+1) < tris->index.size()) {
        vec3i idx1 = tris->index[i+1];
        if (idx1.x == idx0.x && idx1.y == idx0.z) {
          // could merge!!!
          out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx1.z));
          ++i;
          continue;
        }
        if (idx1.x == idx0.z && idx1.z == idx0.x) {
          // could merge!!!
          out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx1.y));
          ++i;
          continue;
        }
      }
      // could not merge :-( - emit tri as degenerate quad
      out->index.push_back(vec4i(idx0.x,idx0.y,idx0.z,idx0.z));
    }
      
    if (tris->vertex.size() == 3*tris->index.size()) {
      return remeshVertices(out);
    }
    else
      return out;
  }